

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackIR.cpp
# Opt level: O1

void __thiscall wasm::StackIROptimizer::dce(StackIROptimizer *this)

{
  StackInst *pSVar1;
  uint uVar2;
  pointer ppSVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  ppSVar3 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppSVar3) {
    uVar4 = 0;
    uVar5 = 1;
    bVar6 = false;
    do {
      pSVar1 = ppSVar3[uVar4];
      if (pSVar1 != (StackInst *)0x0) {
        if (bVar6) {
          uVar2 = pSVar1->op - BlockEnd;
          if ((uVar2 < 0xb) && ((0x7adU >> (uVar2 & 0x1f) & 1) != 0)) {
            bVar6 = false;
          }
          else {
            removeAt(this,uVar5 - 1);
          }
        }
        else if ((pSVar1->type).id == 1) {
          bVar6 = true;
        }
      }
      uVar4 = (ulong)uVar5;
      ppSVar3 = (this->insts->
                super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 1;
    } while (uVar4 < (ulong)((long)(this->insts->
                                   super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3)
            );
  }
  return;
}

Assistant:

void dce() {
    bool inUnreachableCode = false;
    for (Index i = 0; i < insts.size(); i++) {
      auto* inst = insts[i];
      if (!inst) {
        continue;
      }
      if (inUnreachableCode) {
        // Does the unreachable code end here?
        if (isControlFlowBarrier(inst)) {
          inUnreachableCode = false;
        } else {
          // We can remove this.
          removeAt(i);
        }
      } else if (inst->type == Type::unreachable) {
        inUnreachableCode = true;
      }
    }
  }